

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void dumpAlign(DumpState *D,uint align)

{
  uint uVar1;
  uint padding;
  uint align_local;
  DumpState *D_local;
  
  uVar1 = align - (int)(D->offset % (ulong)align);
  if (uVar1 < align) {
    dumpBlock(D,&dumpAlign::paddingContent,(ulong)uVar1);
  }
  return;
}

Assistant:

static void dumpAlign (DumpState *D, unsigned align) {
  unsigned padding = align - cast_uint(D->offset % align);
  if (padding < align) {  /* padding == align means no padding */
    static lua_Integer paddingContent = 0;
    lua_assert(align <= sizeof(lua_Integer));
    dumpBlock(D, &paddingContent, padding);
  }
  lua_assert(D->offset % align == 0);
}